

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O0

QMargins __thiscall QLineEditPrivate::effectiveTextMargins(QLineEditPrivate *this)

{
  long lVar1;
  QMargins QVar2;
  int aright;
  int iVar3;
  int defaultMargin;
  SideWidgetEntryList *pSVar4;
  SideWidgetParameters *in_RDI;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  undefined8 local_18;
  undefined8 local_10;
  SideWidgetEntryList *pSVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  aright = QMargins::left((QMargins *)0x5d29dc);
  pSVar4 = leftSideWidgetList((QLineEditPrivate *)CONCAT44(aright,in_stack_ffffffffffffff70));
  sideWidgetParameters
            ((QLineEditPrivate *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  effectiveTextMargin(in_stack_ffffffffffffff90,
                      (SideWidgetEntryList *)
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),in_RDI);
  QMargins::top((QMargins *)0x5d2a24);
  iVar3 = QMargins::right((QMargins *)0x5d2a32);
  pSVar5 = rightSideWidgetList((QLineEditPrivate *)CONCAT44(aright,in_stack_ffffffffffffff70));
  defaultMargin = (int)pSVar5;
  sideWidgetParameters((QLineEditPrivate *)CONCAT44(iVar3,in_stack_ffffffffffffff88));
  effectiveTextMargin(defaultMargin,(SideWidgetEntryList *)CONCAT44(iVar3,in_stack_ffffffffffffff88)
                      ,in_RDI);
  QMargins::bottom((QMargins *)0x5d2a7a);
  QMargins::QMargins((QMargins *)in_RDI,(int)((ulong)pSVar4 >> 0x20),(int)pSVar4,aright,
                     in_stack_ffffffffffffff70);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QVar2._8_8_ = local_10;
    QVar2._0_8_ = local_18;
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QMargins QLineEditPrivate::effectiveTextMargins() const
{
    return {effectiveTextMargin(textMargins.left(), leftSideWidgetList(), sideWidgetParameters()),
            textMargins.top(),
            effectiveTextMargin(textMargins.right(), rightSideWidgetList(), sideWidgetParameters()),
            textMargins.bottom()};
}